

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_scriptpubkey_csv_2of3_then_2_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t csv_blocks,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  uchar *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  
  sVar6 = scriptint_get_length((ulong)csv_blocks);
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((bytes_out == (uchar *)0x0 || flags != 0) ||
      (0xffee < csv_blocks - 0x11 || (bytes_len != 99 || bytes == (uchar *)0x0))) ||
      written == (size_t *)0x0) {
    iVar5 = -2;
  }
  else {
    if (sVar6 + 0x74 <= len) {
      bytes_out[0] = 't';
      bytes_out[1] = 0x8c;
      bytes_out[2] = 0x8c;
      bytes_out[3] = 'c';
      bytes_out[4] = 'R';
      bytes_out[5] = '!';
      uVar2 = *(undefined8 *)(bytes + 8);
      uVar3 = *(undefined8 *)(bytes + 0x10);
      uVar4 = *(undefined8 *)(bytes + 0x18);
      *(undefined8 *)(bytes_out + 6) = *(undefined8 *)bytes;
      *(undefined8 *)(bytes_out + 0xe) = uVar2;
      *(undefined8 *)(bytes_out + 0x16) = uVar3;
      *(undefined8 *)(bytes_out + 0x1e) = uVar4;
      bytes_out[0x26] = bytes[0x20];
      bytes_out[0x27] = 'g';
      bytes_out[0x28] = (uchar)sVar6;
      sVar7 = scriptint_to_bytes((ulong)csv_blocks,bytes_out + 0x29);
      puVar1 = bytes_out + sVar7 + 0x29;
      puVar1[0] = 0xb2;
      puVar1[1] = 'u';
      puVar1[2] = 'Q';
      puVar1[3] = '\0';
      (bytes_out + sVar7 + 0x2d)[0] = 'h';
      (bytes_out + sVar7 + 0x2d)[1] = '!';
      uVar2 = *(undefined8 *)(bytes + 0x29);
      uVar3 = *(undefined8 *)(bytes + 0x31);
      uVar4 = *(undefined8 *)(bytes + 0x39);
      *(undefined8 *)(bytes_out + sVar7 + 0x2f) = *(undefined8 *)(bytes + 0x21);
      *(undefined8 *)(bytes_out + sVar7 + 0x2f + 8) = uVar2;
      *(undefined8 *)(bytes_out + sVar7 + 0x3f) = uVar3;
      *(undefined8 *)(bytes_out + sVar7 + 0x3f + 8) = uVar4;
      bytes_out[sVar7 + 0x4f] = bytes[0x41];
      bytes_out[sVar7 + 0x50] = '!';
      uVar2 = *(undefined8 *)(bytes + 0x4a);
      uVar3 = *(undefined8 *)(bytes + 0x52);
      uVar4 = *(undefined8 *)(bytes + 0x5a);
      *(undefined8 *)(bytes_out + sVar7 + 0x51) = *(undefined8 *)(bytes + 0x42);
      *(undefined8 *)(bytes_out + sVar7 + 0x51 + 8) = uVar2;
      *(undefined8 *)(bytes_out + sVar7 + 0x61) = uVar3;
      *(undefined8 *)(bytes_out + sVar7 + 0x61 + 8) = uVar4;
      bytes_out[sVar7 + 0x71] = bytes[0x62];
      (bytes_out + sVar7 + 0x72)[0] = 'S';
      (bytes_out + sVar7 + 0x72)[1] = 0xae;
    }
    *written = sVar6 + 0x74;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int wally_scriptpubkey_csv_2of3_then_2_from_bytes(
    const unsigned char *bytes, size_t bytes_len, uint32_t csv_blocks,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t csv_len = scriptint_get_length(csv_blocks);
    size_t script_len = 3 * (EC_PUBLIC_KEY_LEN + 1) + 13 + 1 + csv_len; /* 1 for push */

    if (written)
        *written = 0;

    if (!bytes || bytes_len != 3 * EC_PUBLIC_KEY_LEN ||
        csv_blocks < 17 || csv_blocks > 0xffff || flags || !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    /* The script we create is:
     *     OP_DEPTH OP_1SUB OP_1SUB
     *     OP_IF
     *       # The stack contains 3 items, a dummy push for the off-by-one bug
     *       # in OP_CHECKMULTISIG, and any 2 of the 3 signatures.
     *       OP_2 <main_pubkey>
     *     OP_ELSE
     *       # The stack contains a dummy push as above, and either of the
     *       # recovery signatures.
     *       <csv_blocks> OP_CHECKSEQUENCEVERIFY OP_DROP
     *       # Note OP_0 is a dummy pubkey that can't match any signature. This
     *       # allows us to share the final OP_3 OP_CHECKMULTISIGVERIFY case
     *       # thus reducing the size of the script.
     *       OP_1 OP_0
     *     OP_ENDIF
     *     # Shared code to check the signatures provided
     *     <recovery_pubkey> <recovery_pubkey_2> OP_3 OP_CHECKMULTISIG
     */
    *bytes_out++ = OP_DEPTH;
    *bytes_out++ = OP_1SUB;
    *bytes_out++ = OP_1SUB;
    *bytes_out++ = OP_IF;
    *bytes_out++ = OP_2;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_ELSE;
    *bytes_out++ = csv_len & 0xff;
    bytes_out += scriptint_to_bytes(csv_blocks, bytes_out);
    *bytes_out++ = OP_CHECKSEQUENCEVERIFY;
    *bytes_out++ = OP_DROP;
    *bytes_out++ = OP_1;
    *bytes_out++ = OP_0;
    *bytes_out++ = OP_ENDIF;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes + EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes + EC_PUBLIC_KEY_LEN * 2, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_3;
    *bytes_out++ = OP_CHECKMULTISIG;

    *written = script_len;
    return WALLY_OK;
}